

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O3

void __thiscall Colour::Colour(Colour *this,string *name,int r,int g,int b)

{
  GLfloat *pGVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->r = r;
  this->g = g;
  this->b = b;
  pGVar1 = (GLfloat *)operator_new__(0xc);
  this->colour = pGVar1;
  *pGVar1 = (float)r / 255.0;
  pGVar1[1] = (float)g / 255.0;
  pGVar1[2] = (float)b / 255.0;
  std::__cxx11::string::_M_assign((string *)&this->name);
  return;
}

Assistant:

Colour::Colour(const string& name, int r, int g, int b) {
    this->r = r;
    this->g = g;
    this->b = b;
    
    colour = new GLfloat[3];
    this->colour[0] = r/255.f;
    this->colour[1] = g/255.f;
    this->colour[2] = b/255.f;
    
    this->name = name;
}